

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy.c
# Opt level: O0

log_policy
log_policy_create(log_aspect_id aspect_id,log_policy_interface iface,log_policy_ctor ctor)

{
  int iVar1;
  log_policy_ctor in_RDX;
  log_policy_interface in_RSI;
  log_aspect_id in_EDI;
  log_policy policy;
  log_policy local_8;
  
  if (in_RSI == (log_policy_interface)0x0) {
    local_8 = (log_policy)0x0;
  }
  else {
    local_8 = (log_policy)malloc(0x28);
    if (local_8 == (log_policy)0x0) {
      local_8 = (log_policy)0x0;
    }
    else {
      local_8->aspect = (log_aspect)0x0;
      local_8->aspect_id = in_EDI;
      local_8->data = (log_policy_data)0x0;
      local_8->iface = in_RSI;
      local_8->id = 0;
      iVar1 = (*local_8->iface->create)(local_8,in_RDX);
      if (iVar1 != 0) {
        free(local_8);
        local_8 = (log_policy)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

log_policy log_policy_create(enum log_aspect_id aspect_id, const log_policy_interface iface, const log_policy_ctor ctor)
{
	if (iface != NULL)
	{
		log_policy policy = malloc(sizeof(struct log_policy_type));

		if (policy == NULL)
		{
			return NULL;
		}

		policy->aspect = NULL;
		policy->aspect_id = aspect_id;
		policy->data = NULL;
		policy->iface = iface;
		policy->id = 0;

		if (policy->iface->create(policy, ctor) != 0)
		{
			free(policy);

			return NULL;
		}

		return policy;
	}

	return NULL;
}